

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O1

void __thiscall Atari2600::TIA::set_colour_palette_entry(TIA *this,size_t index,uint8_t colour)

{
  int iVar1;
  byte bVar2;
  
  if (this->tv_standard_ == NTSC) {
    bVar2 = 0xff;
    if (colour < 0x10) goto LAB_002ff9da;
    iVar1 = (uint)(colour >> 4) * -0x7f;
    bVar2 = ((char)(uint)((ulong)((long)iVar1 * 0x4ec4ec4f) >> 0x22) - (char)(iVar1 >> 0x1f)) + 0x1a
    ;
  }
  else {
    bVar2 = 0xff;
    if ((byte)(colour + 0x20) < 0x40) goto LAB_002ff9da;
    bVar2 = colour >> 4 & 1;
    bVar2 = (byte)((uint)((-bVar2 ^ colour >> 5) + bVar2 + 6 & 0xf) * 0xa95aa >> 0x10);
  }
  bVar2 = bVar2 & 0x7f;
LAB_002ff9da:
  (this->colour_palette_)._M_elems[index].original = colour;
  *(char *)&(this->colour_palette_)._M_elems[index].luminance_phase =
       (char)((uint)(colour & 0xe) * 0x1237b6 >> 0x10);
  *(byte *)((long)&(this->colour_palette_)._M_elems[index].luminance_phase + 1) = bVar2;
  return;
}

Assistant:

void TIA::set_colour_palette_entry(size_t index, uint8_t colour) {
	const uint8_t luminance = ((colour & 14) * 255) / 14;

	uint8_t phase = colour >> 4;

	if(tv_standard_ == OutputMode::NTSC) {
		if(!phase) phase = 255;
		else {
			phase = -(phase * 127) / 13;
			phase -= 102;
			phase &= 127;
		}
	} else {
		if(phase < 2 || phase > 13) {
			phase = 255;
		} else {
			const auto direction = phase & 1;

			phase >>= 1;
			if(direction) phase ^= 0xf;
			phase = (phase + 6 + direction) & 0xf;

			phase = (phase * 127) / 12;
			phase &= 127;
		}
	}

	colour_palette_[index].original = colour;
	uint8_t *target = reinterpret_cast<uint8_t *>(&colour_palette_[index].luminance_phase);
	target[0] = luminance;
	target[1] = phase;
}